

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::InitializeFromObjForObject
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_68 [8];
  string struct_object;
  string struct_var;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Variable_abi_cxx11_
            ((string *)((long)&struct_object.field_2 + 8),&this->namer_,struct_def);
  IdlNamer::ObjectType_abi_cxx11_((string *)local_68,&this->namer_,struct_def);
  GenIndents_abi_cxx11_(&local_b8,this,1);
  std::operator+(&local_98,&local_b8,"@classmethod");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  GenIndents_abi_cxx11_(&local_138,this,1);
  std::operator+(&local_118,&local_138,"def InitFromObj(cls, ");
  std::operator+(&local_f8,&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&struct_object.field_2 + 8));
  std::operator+(&local_d8,&local_f8,"):");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  GenIndents_abi_cxx11_(&local_1b8,this,2);
  std::operator+(&local_198,&local_1b8,"x = ");
  std::operator+(&local_178,&local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  std::operator+(&local_158,&local_178,"()");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  GenIndents_abi_cxx11_(&local_238,this,2);
  std::operator+(&local_218,&local_238,"x._UnPack(");
  std::operator+(&local_1f8,&local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&struct_object.field_2 + 8));
  std::operator+(&local_1d8,&local_1f8,")");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  GenIndents_abi_cxx11_(&local_278,this,2);
  std::operator+(&local_258,&local_278,"return x");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::operator+=((string *)code_ptr,"\n");
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(struct_object.field_2._M_local_buf + 8));
  return;
}

Assistant:

void InitializeFromObjForObject(const StructDef &struct_def,
                                  std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto struct_var = namer_.Variable(struct_def);
    const auto struct_object = namer_.ObjectType(struct_def);

    code += GenIndents(1) + "@classmethod";
    code += GenIndents(1) + "def InitFromObj(cls, " + struct_var + "):";
    code += GenIndents(2) + "x = " + struct_object + "()";
    code += GenIndents(2) + "x._UnPack(" + struct_var + ")";
    code += GenIndents(2) + "return x";
    code += "\n";
  }